

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O2

QColor mergedColors(QColor *colorA,QColor *colorB,int factor)

{
  QColor QVar1;
  int iVar2;
  long in_FS_OFFSET;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = *(undefined8 *)colorA;
  uStack_40 = *(undefined8 *)((long)&colorA->ct + 4);
  QColor::red();
  QColor::red();
  iVar2 = (int)&local_48;
  QColor::setRed(iVar2);
  QColor::green();
  QColor::green();
  QColor::setGreen(iVar2);
  QColor::blue();
  QColor::blue();
  QColor::setBlue(iVar2);
  QVar1._8_8_ = uStack_40;
  QVar1._0_8_ = local_48;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

static QColor mergedColors(const QColor &colorA, const QColor &colorB, int factor = 50)
{
    const int maxFactor = 100;
    QColor tmp = colorA;
    tmp.setRed((tmp.red() * factor) / maxFactor + (colorB.red() * (maxFactor - factor)) / maxFactor);
    tmp.setGreen((tmp.green() * factor) / maxFactor + (colorB.green() * (maxFactor - factor)) / maxFactor);
    tmp.setBlue((tmp.blue() * factor) / maxFactor + (colorB.blue() * (maxFactor - factor)) / maxFactor);
    return tmp;
}